

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::UpdateTexture
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,ITexture *pTexture,Uint32 MipLevel,
          Uint32 Slice,Box *DstBox,TextureSubResData *SubresData,
          RESOURCE_STATE_TRANSITION_MODE SrcBufferTransitionMode,
          RESOURCE_STATE_TRANSITION_MODE TextureTransitionMode)

{
  Uint32 *pUVar1;
  COMMAND_QUEUE_TYPE CVar2;
  int iVar3;
  undefined4 extraout_var;
  COMMAND_QUEUE_TYPE Type;
  COMMAND_QUEUE_TYPE extraout_DL;
  string local_78;
  TextureSubResData *local_58;
  String local_50;
  
  Type = (COMMAND_QUEUE_TYPE)MipLevel;
  CVar2 = (this->m_Desc).QueueType;
  local_58 = SubresData;
  if (CVar2 == COMMAND_QUEUE_TYPE_UNKNOWN) {
    if ((this->m_Desc).IsDeferred == false) {
      FormatString<char[79]>
                (&local_78,
                 (char (*) [79])
                 "Queue type may never be unknown for immediate contexts. This looks like a bug.");
      DebugAssertionFailed
                (local_78._M_dataplus._M_p,"UpdateTexture",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x736);
      std::__cxx11::string::~string((string *)&local_78);
    }
    FormatString<char[97]>
              (&local_78,
               (char (*) [97])
               "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
              );
    DebugAssertionFailed
              (local_78._M_dataplus._M_p,"UpdateTexture",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x736);
    std::__cxx11::string::~string((string *)&local_78);
    CVar2 = (this->m_Desc).QueueType;
    Type = extraout_DL;
  }
  if ((CVar2 & COMMAND_QUEUE_TYPE_TRANSFER) == COMMAND_QUEUE_TYPE_UNKNOWN) {
    GetCommandQueueTypeString_abi_cxx11_(&local_50,(Diligent *)(ulong)CVar2,Type);
    FormatString<char[14],char[22],std::__cxx11::string,char[8]>
              (&local_78,(Diligent *)"UpdateTexture",(char (*) [14])0x7e8bba,
               (char (*) [22])&local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",
               (char (*) [8])SubresData);
    std::__cxx11::string::~string((string *)&local_50);
    DebugAssertionFailed
              (local_78._M_dataplus._M_p,"UpdateTexture",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x736);
    std::__cxx11::string::~string((string *)&local_78);
  }
  if (pTexture == (ITexture *)0x0) {
    FormatString<char[26]>(&local_78,(char (*) [26])0x7eac81);
    DebugAssertionFailed
              (local_78._M_dataplus._M_p,"UpdateTexture",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x737);
    std::__cxx11::string::~string((string *)&local_78);
  }
  if ((this->m_pActiveRenderPass).m_pObject != (RenderPassVkImpl *)0x0) {
    FormatString<char[59]>
              (&local_78,(char (*) [59])"UpdateTexture command must be used outside of render pass."
              );
    DebugAssertionFailed
              (local_78._M_dataplus._M_p,"UpdateTexture",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x738);
    std::__cxx11::string::~string((string *)&local_78);
  }
  iVar3 = (*(pTexture->super_IDeviceObject).super_IObject._vptr_IObject[4])(pTexture);
  ValidateUpdateTextureParams
            ((TextureDesc *)CONCAT44(extraout_var,iVar3),MipLevel,Slice,DstBox,local_58);
  pUVar1 = &(this->m_Stats).CommandCounters.UpdateTexture;
  *pUVar1 = *pUVar1 + 1;
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::UpdateTexture(
    ITexture*                      pTexture,
    Uint32                         MipLevel,
    Uint32                         Slice,
    const Box&                     DstBox,
    const TextureSubResData&       SubresData,
    RESOURCE_STATE_TRANSITION_MODE SrcBufferTransitionMode,
    RESOURCE_STATE_TRANSITION_MODE TextureTransitionMode)
{
    DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(COMMAND_QUEUE_TYPE_TRANSFER, "UpdateTexture");
    DEV_CHECK_ERR(pTexture != nullptr, "pTexture must not be null");
    DEV_CHECK_ERR(m_pActiveRenderPass == nullptr, "UpdateTexture command must be used outside of render pass.");

    ValidateUpdateTextureParams(pTexture->GetDesc(), MipLevel, Slice, DstBox, SubresData);
    ++m_Stats.CommandCounters.UpdateTexture;
}